

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeClassPrototype(ExpressionContext *ctx,SynClassPrototype *syntax)

{
  Allocator *allocator;
  TypeBase *pTVar1;
  uint nameHash;
  int iVar2;
  TypeClass *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *in_R8;
  InplaceStr name;
  InplaceStr typeName;
  SynIdentifier local_78;
  ExprBase *pEVar3;
  
  name.end = in_R8;
  name.begin = (syntax->name->name).end;
  anon_unknown.dwarf_ff84f::CheckTypeConflict
            ((anon_unknown_dwarf_ff84f *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,name);
  typeName = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  nameHash = InplaceStr::hash(&typeName);
  this = (TypeClass *)anon_unknown.dwarf_ff84f::LookupTypeByName(ctx,nameHash);
  if (this == (TypeClass *)0x0) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
    this = (TypeClass *)CONCAT44(extraout_var,iVar2);
    allocator = ctx->allocator;
    SynIdentifier::SynIdentifier(&local_78,syntax->name,typeName);
    TypeClass::TypeClass
              (this,allocator,&local_78,&syntax->super_SynBase,ctx->scope,
               (TypeGenericClassProto *)0x0,(IntrusiveList<MatchData>)ZEXT816(0),false,
               (TypeClass *)0x0);
    ExpressionContext::AddType(ctx,(TypeBase *)this);
  }
  else if (((this->super_TypeStruct).super_TypeBase.typeID != 0x18) || (this->completed == true)) {
    anon_unknown.dwarf_ff84f::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
               (ulong)(uint)(*(int *)&(syntax->name->name).end - (int)(syntax->name->name).begin));
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar3 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
  pTVar1 = ctx->typeVoid;
  pEVar3->typeID = 0x2b;
  pEVar3->source = &syntax->super_SynBase;
  pEVar3->type = pTVar1;
  pEVar3->next = (ExprBase *)0x0;
  pEVar3->listed = false;
  pEVar3->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3ec0;
  pEVar3[1]._vptr_ExprBase = (_func_int **)this;
  return pEVar3;
}

Assistant:

ExprBase* AnalyzeClassPrototype(ExpressionContext &ctx, SynClassPrototype *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
	{
		TypeClass *originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition || originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

		return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, originalDefinition);
	}

	IntrusiveList<MatchData> actualGenerics;

	TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, typeName), syntax, ctx.scope, NULL, actualGenerics, false, NULL);

	ctx.AddType(classType);

	return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, classType);
}